

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O3

int mqtt_codec_bytesReceived(MQTTCODEC_HANDLE handle,uchar *buffer,size_t size)

{
  byte bVar1;
  int iVar2;
  uchar *puVar3;
  size_t sVar4;
  BUFFER_HANDLE handle_00;
  LOGGER_LOG p_Var5;
  CONTROL_PACKET_TYPE CVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  ulong uVar10;
  
  if (handle == (MQTTCODEC_HANDLE)0x0) {
    iVar2 = 0x425;
  }
  else {
    iVar2 = 0x42c;
    if (size == 0 || buffer == (uchar *)0x0) {
LAB_00163de7:
      handle->currPacket = PACKET_TYPE_ERROR;
    }
    else {
      uVar10 = 0;
      do {
        bVar1 = buffer[uVar10];
        if (handle->codecState == CODEC_STATE_VAR_HEADER) {
          if (handle->headerData == (BUFFER_HANDLE)0x0) {
            handle->codecState = CODEC_STATE_PAYLOAD;
          }
          else {
            puVar3 = BUFFER_u_char(handle->headerData);
            if (puVar3 == (uchar *)0x0) {
              iVar2 = 0x48c;
              goto LAB_00163de7;
            }
            sVar4 = handle->bufferOffset;
            handle->bufferOffset = sVar4 + 1;
            puVar3[sVar4] = bVar1;
            sVar4 = BUFFER_length(handle->headerData);
            if (sVar4 <= handle->bufferOffset) goto LAB_00163f48;
          }
        }
        else {
          if (handle->codecState != CODEC_STATE_FIXED_HEADER) {
            iVar2 = 0x4a1;
            goto LAB_00163de7;
          }
          if (handle->currPacket == UNKNOWN_TYPE) {
            handle->headerFlags = (uint)bVar1 & 0xf;
            CVar6 = (uint)bVar1 & PACKET_INVALID2_TYPE;
            handle->currPacket = CVar6;
            iVar2 = (*(code *)(&DAT_001946f4 +
                              *(int *)(&DAT_001946f4 + (ulong)((uint)CVar6 >> 4) * 4)))();
            return iVar2;
          }
          sVar4 = handle->remainLenIndex;
          handle->remainLenIndex = sVar4 + 1;
          handle->storeRemainLen[sVar4] = bVar1;
          if ((char)bVar1 < '\0') {
            if (handle->remainLenIndex == 4) {
              p_Var5 = xlogging_get_log_function();
              iVar2 = 0x46d;
              if (p_Var5 != (LOGGER_LOG)0x0) {
                pcVar9 = "MQTT packet len is invalid";
                iVar7 = 0x246;
                goto LAB_00164041;
              }
              goto LAB_00163de7;
            }
          }
          else {
            uVar8 = handle->storeRemainLen[0] & 0x7f;
            sVar4 = (size_t)uVar8;
            if ((char)handle->storeRemainLen[0] < '\0') {
              uVar8 = uVar8 | (handle->storeRemainLen[1] & 0x7f) << 7;
              sVar4 = (size_t)uVar8;
              if ((char)handle->storeRemainLen[1] < '\0') {
                if ((char)handle->storeRemainLen[2] < '\0') {
                  p_Var5 = xlogging_get_log_function();
                  iVar2 = 0x46d;
                  if (p_Var5 != (LOGGER_LOG)0x0) {
                    pcVar9 = "Receive buffer too large for MQTT packet";
                    iVar7 = 0x21d;
                    goto LAB_00164041;
                  }
                  goto LAB_00163de7;
                }
                sVar4 = (size_t)(uVar8 | (handle->storeRemainLen[2] & 0x7f) << 0xe);
              }
            }
            handle->codecState = CODEC_STATE_VAR_HEADER;
            handle->remainLenIndex = 0;
            handle->storeRemainLen[0] = '\0';
            handle->storeRemainLen[1] = '\0';
            handle->storeRemainLen[2] = '\0';
            handle->storeRemainLen[3] = '\0';
            if ((int)sVar4 != 0) {
              handle->bufferOffset = 0;
              handle_00 = BUFFER_new();
              handle->headerData = handle_00;
              if (handle_00 == (BUFFER_HANDLE)0x0) {
                p_Var5 = xlogging_get_log_function();
                iVar2 = 0x46d;
                if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00163de7;
                pcVar9 = "Failed BUFFER_new";
                iVar7 = 0x22f;
              }
              else {
                iVar2 = BUFFER_pre_build(handle_00,sVar4);
                if (iVar2 == 0) goto LAB_00163f39;
                p_Var5 = xlogging_get_log_function();
                iVar2 = 0x46d;
                if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00163de7;
                pcVar9 = "Failed BUFFER_pre_build";
                iVar7 = 0x237;
              }
LAB_00164041:
              iVar2 = 0x46d;
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_codec.c"
                        ,"prepareheaderDataInfo",iVar7,1,pcVar9);
              goto LAB_00163de7;
            }
          }
LAB_00163f39:
          if (handle->currPacket == PINGRESP_TYPE) {
            if (buffer[uVar10] != '\0') {
              iVar2 = 0x47a;
              goto LAB_00163de7;
            }
LAB_00163f48:
            completePacketData(handle);
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < size);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int mqtt_codec_bytesReceived(MQTTCODEC_HANDLE handle, const unsigned char* buffer, size_t size)
{
    int result;
    MQTTCODEC_INSTANCE* codec_Data = (MQTTCODEC_INSTANCE*)handle;
    /* Codes_SRS_MQTT_CODEC_07_031: [If the parameters handle or buffer is NULL then mqtt_codec_bytesReceived shall return a non-zero value.] */
    if (codec_Data == NULL)
    {
        result = MU_FAILURE;
    }
    /* Codes_SRS_MQTT_CODEC_07_031: [If the parameters handle or buffer is NULL then mqtt_codec_bytesReceived shall return a non-zero value.] */
    /* Codes_SRS_MQTT_CODEC_07_032: [If the parameters size is zero then mqtt_codec_bytesReceived shall return a non-zero value.] */
    else if (buffer == NULL || size == 0)
    {
        codec_Data->currPacket = PACKET_TYPE_ERROR;
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_MQTT_CODEC_07_033: [mqtt_codec_bytesReceived constructs a sequence of bytes into the corresponding MQTT packets and on success returns zero.] */
        result = 0;
        size_t index = 0;
        for (index = 0; index < size && result == 0; index++)
        {
            uint8_t iterator = ((int8_t*)buffer)[index];
            if (codec_Data->codecState == CODEC_STATE_FIXED_HEADER)
            {
                if (codec_Data->currPacket == UNKNOWN_TYPE)
                {
                    codec_Data->currPacket = processControlPacketType(iterator, &codec_Data->headerFlags);

                    // validate packet type and invalid reserved header flags
                    switch (codec_Data->currPacket)
                    {
                        case PACKET_INVALID1_TYPE:
                        case PACKET_INVALID2_TYPE:
                            codec_Data->currPacket = PACKET_TYPE_ERROR;
                            result = MU_FAILURE;
                            break;

                        case CONNECT_TYPE:
                        case CONNACK_TYPE:
                        case PUBACK_TYPE:
                        case PUBREC_TYPE:
                        case PUBCOMP_TYPE:
                        case SUBACK_TYPE:
                        case UNSUBACK_TYPE:
                        case PINGREQ_TYPE:
                        case PINGRESP_TYPE:
                        case DISCONNECT_TYPE:
                            if (codec_Data->headerFlags & 0x0F) // flags must be all zeros
                            {
                                codec_Data->currPacket = PACKET_TYPE_ERROR;
                                result = MU_FAILURE;
                            }
                            break;

                        case PUBREL_TYPE:
                        case SUBSCRIBE_TYPE:
                        case UNSUBSCRIBE_TYPE:
                            if ((codec_Data->headerFlags & 0x0F) != 0x02) // only bit 1 must be set
                            {
                                codec_Data->currPacket = PACKET_TYPE_ERROR;
                                result = MU_FAILURE;
                            }
                            break;

                        case PUBLISH_TYPE:
                        case CONTROL_PACKET_TYPE_INVALID: 
                        case PACKET_TYPE_ERROR:
                        case UNKNOWN_TYPE:
                            break;
                    }
                }
                else
                {
                    if (prepareheaderDataInfo(codec_Data, iterator) != 0)
                    {
                        /* Codes_SRS_MQTT_CODEC_07_035: [If any error is encountered then the packet state will be marked as error and mqtt_codec_bytesReceived shall return a non-zero value.] */
                        codec_Data->currPacket = PACKET_TYPE_ERROR;
                        result = MU_FAILURE;
                    }
                    else if (codec_Data->currPacket == PINGRESP_TYPE)
                    {
                        // PINGRESP must not have a payload
                        if (((int8_t*)buffer)[index] == 0)
                        {
                            /* Codes_SRS_MQTT_CODEC_07_034: [Upon a constructing a complete MQTT packet mqtt_codec_bytesReceived shall call the ON_PACKET_COMPLETE_CALLBACK function.] */
                            completePacketData(codec_Data);
                        }
                        else
                        {
                            codec_Data->currPacket = PACKET_TYPE_ERROR;
                            result = MU_FAILURE;
                        }
                    }
                }
            }
            else if (codec_Data->codecState == CODEC_STATE_VAR_HEADER)
            {
                if (codec_Data->headerData == NULL)
                {
                    codec_Data->codecState = CODEC_STATE_PAYLOAD;
                }
                else
                {
                    uint8_t* dataBytes = BUFFER_u_char(codec_Data->headerData);
                    if (dataBytes == NULL)
                    {
                        /* Codes_SRS_MQTT_CODEC_07_035: [If any error is encountered then the packet state will be marked as error and mqtt_codec_bytesReceived shall return a non-zero value.] */
                        codec_Data->currPacket = PACKET_TYPE_ERROR;
                        result = MU_FAILURE;
                    }
                    else
                    {
                        // Increment the data
                        dataBytes += codec_Data->bufferOffset++;
                        *dataBytes = iterator;

                        size_t totalLen = BUFFER_length(codec_Data->headerData);
                        if (codec_Data->bufferOffset >= totalLen)
                        {
                            /* Codes_SRS_MQTT_CODEC_07_034: [Upon a constructing a complete MQTT packet mqtt_codec_bytesReceived shall call the ON_PACKET_COMPLETE_CALLBACK function.] */
                            completePacketData(codec_Data);
                        }
                    }
                }
            }
            else
            {
                /* Codes_SRS_MQTT_CODEC_07_035: [If any error is encountered then the packet state will be marked as error and mqtt_codec_bytesReceived shall return a non-zero value.] */
                codec_Data->currPacket = PACKET_TYPE_ERROR;
                result = MU_FAILURE;
            }
        }
    }
    return result;
}